

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void ls_path(string *path_)

{
  ostream *poVar1;
  string *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  output o;
  allocator<char> local_a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_70;
  undefined1 local_50 [40];
  string local_28 [32];
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Running: /bin/ls ");
  poVar1 = std::operator<<(poVar1,(string *)path_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"/bin/ls",(allocator<char> *)&local_90);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a8,path_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_a9);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  just::process::run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((output *)local_50,(process *)&local_a8,&local_90,&local_70,in_R8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  poVar1 = std::operator<<((ostream *)&std::cout,"Standard output:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,(string *)(local_50 + 8));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"-------------");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Standard error:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"-------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  just::process::output::~output((output *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void ls_path(const std::string& path_)
{
  using std::cout;
  using std::endl;
  using std::vector;
  using std::string;

  using just::process::output;
  using just::process::run;

  vector<string> cmd;
#ifdef _WIN32
  cout << "Running: dir " << path_ << endl;
  cmd.push_back("c:\\windows\\system32\\cmd.exe");
  cmd.push_back("/c");
  cmd.push_back("dir");
  cmd.push_back(path_);
#else
  cout << "Running: /bin/ls " << path_ << endl;
  cmd.push_back("/bin/ls");
  cmd.push_back(path_);
#endif

  const output o = run(cmd, "");

  cout
    << "Standard output:" << endl
    << o.standard_output() << endl
    << "-------------" << endl
    << "Standard error:" << endl
    << o.standard_error() << endl
    << "-------------" << endl;
}